

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnBrTableExpr
          (BinaryReaderIR *this,Index num_targets,Index *target_depths,Index default_target_depth)

{
  Result RVar1;
  long lVar2;
  Var local_b0;
  Location local_68;
  BinaryReaderIR *local_48;
  _Head_base<0UL,_wabt::Expr_*,_false> local_40;
  Expr *local_38;
  unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> expr;
  
  MakeUnique<wabt::BrTableExpr>();
  local_68.field_1.field_0.line = 0;
  local_68.field_1._4_8_ = 0;
  local_68.filename.data_ = (char *)0x0;
  local_68.filename.size_._0_4_ = 0;
  local_68.filename.size_._4_4_ = 0;
  Var::Var(&local_b0,default_target_depth,&local_68);
  Var::operator=((Var *)&local_38[1].loc,&local_b0);
  local_48 = this;
  Var::~Var(&local_b0);
  std::vector<wabt::Var,_std::allocator<wabt::Var>_>::resize
            ((vector<wabt::Var,_std::allocator<wabt::Var>_> *)(local_38 + 1),(ulong)num_targets);
  if (num_targets != 0) {
    lVar2 = 0;
    do {
      local_68.field_1.field_0.line = 0;
      local_68.field_1._4_8_ = 0;
      local_68.filename.data_ = (char *)0x0;
      local_68.filename.size_._0_4_ = 0;
      local_68.filename.size_._4_4_ = 0;
      Var::Var(&local_b0,*target_depths,&local_68);
      Var::operator=((Var *)((long)local_38[1]._vptr_Expr + lVar2),&local_b0);
      Var::~Var(&local_b0);
      target_depths = target_depths + 1;
      lVar2 = lVar2 + 0x48;
    } while ((ulong)num_targets * 0x48 != lVar2);
  }
  local_40._M_head_impl = local_38;
  local_38 = (Expr *)0x0;
  RVar1 = AppendExpr(local_48,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_40)
  ;
  if (local_40._M_head_impl != (Expr *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Expr[1])();
  }
  local_40._M_head_impl = (Expr *)0x0;
  if (local_38 != (Expr *)0x0) {
    (**(code **)(*(long *)local_38 + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnBrTableExpr(Index num_targets,
                                     Index* target_depths,
                                     Index default_target_depth) {
  auto expr = MakeUnique<BrTableExpr>();
  expr->default_target = Var(default_target_depth);
  expr->targets.resize(num_targets);
  for (Index i = 0; i < num_targets; ++i) {
    expr->targets[i] = Var(target_depths[i]);
  }
  return AppendExpr(std::move(expr));
}